

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c_builder.c
# Opt level: O3

int gen_builder_struct_call_list
              (fb_output_t *out,fb_compound_type_t *ct,int index,int arg_count,int is_macro)

{
  uint uVar1;
  char *pcVar2;
  FILE *__stream;
  int iVar3;
  uint uVar4;
  char *cont;
  
  uVar1 = get_total_struct_field_count(ct);
  if (0 < (int)uVar1) {
    pcVar2 = "\\\n";
    if (is_macro == 0) {
      pcVar2 = "\n";
    }
    uVar4 = 0;
    iVar3 = arg_count;
    do {
      if (arg_count != 0) {
        if (uVar4 == 0) {
          __stream = (FILE *)out->fp;
          if (4 < arg_count) goto LAB_0010faab;
        }
        else {
          __stream = (FILE *)out->fp;
          if (2 < iVar3 && (uVar4 & 3) == 0) {
LAB_0010faab:
            fprintf(__stream,",%s  ",pcVar2);
            goto LAB_0010fac0;
          }
        }
        fwrite(", ",2,1,__stream);
      }
LAB_0010fac0:
      fprintf((FILE *)out->fp,"v%i",(ulong)(index + uVar4));
      uVar4 = uVar4 + 1;
      iVar3 = iVar3 + -1;
    } while (uVar1 != uVar4);
    index = index + uVar4;
  }
  return index;
}

Assistant:

static int gen_builder_struct_call_list(fb_output_t *out, fb_compound_type_t *ct, int index, int arg_count, int is_macro)
{
    int i;
    int len = get_total_struct_field_count(ct);

    for (i = 0; i < len; ++i) {
        gen_comma(out, i, arg_count, is_macro);
        fprintf(out->fp, "v%i", index++);
    }
    return index;
}